

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

_Bool validate_fp16(ggml_fp16_t f,size_t i)

{
  char *__format;
  
  if ((f & 0x7fff) == 0x7c00) {
    __format = "ggml_validate_row_data: found inf value at block %zu\n";
  }
  else {
    if ((f & 0x3ff) == 0 || (~f & 0x7c00) != 0) {
      return true;
    }
    __format = "ggml_validate_row_data: found nan value at block %zu\n";
  }
  fprintf(_stderr,__format,i);
  return false;
}

Assistant:

static bool validate_fp16(ggml_fp16_t f, size_t i) {
    if (isinf_fp16(f)) {
        fprintf(stderr, "ggml_validate_row_data: found inf value at block %zu\n", i);
        return false;
    }

    if (isnan_fp16(f)) {
        fprintf(stderr, "ggml_validate_row_data: found nan value at block %zu\n", i);
        return false;
    }

    return true;
}